

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.cpp
# Opt level: O0

optional<QUrl> HPack::makePromiseKeyUrl(HttpHeader *requestHeader)

{
  QByteArrayView s;
  QByteArrayView s_00;
  QByteArrayView s_01;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QByteArrayView a;
  QByteArrayView a_00;
  bool bVar1;
  int iVar2;
  reference pHVar3;
  iterator __t;
  iterator pvVar4;
  QByteArrayView *pQVar5;
  ulong uVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar7;
  _Storage<QUrl,_false> in_RDI;
  long in_FS_OFFSET;
  optional<QUrl> oVar8;
  difference_type index;
  QByteArrayView *it;
  HeaderField *field;
  HttpHeader *__range1;
  QUrl url;
  QByteArrayView method;
  anon_class_1_0_00000001 optionalIsSet;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::optional<QByteArrayView>,_4UL> pseudoHeaders;
  QByteArrayView names [4];
  __normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
  *in_stack_fffffffffffffdc8;
  QByteArray *in_stack_fffffffffffffdd0;
  QByteArrayView *in_stack_fffffffffffffdd8;
  QByteArrayView *in_stack_fffffffffffffde0;
  QByteArrayView *in_stack_fffffffffffffde8;
  CaseSensitivity cs;
  _Storage<QUrl,_false> _Var9;
  QByteArrayView *pQVar10;
  QByteArrayView *local_1f0;
  difference_type in_stack_fffffffffffffe20;
  QByteArrayView *in_stack_fffffffffffffe28;
  undefined1 local_190 [24];
  qsizetype local_178;
  storage_type *local_170;
  undefined1 local_158 [24];
  qsizetype local_140;
  storage_type *local_138;
  QUrl local_108 [5];
  qsizetype local_e0;
  storage_type *local_d8;
  undefined1 local_c9;
  HeaderField *local_b8;
  __normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
  local_b0;
  QByteArrayView local_a8 [6];
  QByteArrayView local_48 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  _Var9 = in_RDI;
  memcpy(local_48,&DAT_0049d570,0x40);
  memset(local_a8,0xaa,0x60);
  memset(local_a8,0,0x60);
  pQVar10 = local_48;
  pQVar5 = local_a8;
  do {
    local_1f0 = pQVar5;
    std::optional<QByteArrayView>::optional((optional<QByteArrayView> *)0x2922a2);
    pQVar5 = (QByteArrayView *)&local_1f0[1].m_data;
  } while ((QByteArrayView *)&local_1f0[1].m_data != pQVar10);
  local_b0._M_current = (HeaderField *)0xaaaaaaaaaaaaaaaa;
  local_b0._M_current =
       (HeaderField *)
       std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::begin
                 ((vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> *)
                  in_stack_fffffffffffffdd0);
  local_b8 = (HeaderField *)0xaaaaaaaaaaaaaaaa;
  local_b8 = (HeaderField *)
             std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::end
                       ((vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> *)
                        in_stack_fffffffffffffdd0);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
                        *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    if (!bVar1) break;
    pHVar3 = __gnu_cxx::
             __normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
             ::operator*(&local_b0);
    in_stack_fffffffffffffdd8 = std::begin<QByteArrayView_const,4ul>(&local_48);
    in_stack_fffffffffffffde0 = std::end<QByteArrayView_const,4ul>(&local_48);
    QByteArrayView::QByteArrayView<QByteArray,_true>
              (in_stack_fffffffffffffde0,(QByteArray *)in_stack_fffffffffffffdd8);
    in_stack_fffffffffffffde8 =
         std::find<QByteArrayView_const*,QByteArrayView>
                   (local_1f0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    in_stack_fffffffffffffe28 = in_stack_fffffffffffffde8;
    pQVar5 = std::end<QByteArrayView_const,4ul>(&local_48);
    if (in_stack_fffffffffffffde8 != pQVar5) {
      std::begin<QByteArrayView_const,4ul>(&local_48);
      in_stack_fffffffffffffe20 =
           std::distance<QByteArrayView_const*>(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0)
      ;
      bVar1 = QByteArray::isEmpty((QByteArray *)0x2923fb);
      if (!bVar1) {
        std::array<std::optional<QByteArrayView>,_4UL>::at
                  ((array<std::optional<QByteArrayView>,_4UL> *)in_stack_fffffffffffffdd0,
                   (size_type)in_stack_fffffffffffffdc8);
        bVar1 = std::optional<QByteArrayView>::has_value((optional<QByteArrayView> *)0x292419);
        if (!bVar1) {
          in_stack_fffffffffffffdd0 = &pHVar3->value;
          std::array<std::optional<QByteArrayView>,_4UL>::operator[]
                    ((array<std::optional<QByteArrayView>,_4UL> *)in_stack_fffffffffffffde0,
                     (size_type)in_stack_fffffffffffffdd8);
          std::optional<QByteArrayView>::operator=
                    ((optional<QByteArrayView> *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0
                    );
          goto LAB_0029245b;
        }
      }
      std::optional<QUrl>::optional((optional<QUrl> *)0x292429);
      uVar7 = extraout_RDX;
      goto LAB_0029279c;
    }
LAB_0029245b:
    __gnu_cxx::
    __normal_iterator<const_HPack::HeaderField_*,_std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>
    ::operator++(&local_b0);
  }
  local_c9 = 0xaa;
  __t = std::array<std::optional<QByteArrayView>,_4UL>::begin
                  ((array<std::optional<QByteArrayView>,_4UL> *)0x292489);
  cs = (CaseSensitivity)((ulong)local_1f0 >> 0x20);
  pvVar4 = std::array<std::optional<QByteArrayView>,_4UL>::end
                     ((array<std::optional<QByteArrayView>,_4UL> *)0x29249a);
  bVar1 = std::
          all_of<std::optional<QByteArrayView>*,HPack::makePromiseKeyUrl(std::vector<HPack::HeaderField,std::allocator<HPack::HeaderField>>const&)::__0>
                    (__t,pvVar4);
  if (bVar1) {
    local_e0 = 0xaaaaaaaaaaaaaaaa;
    local_d8 = (storage_type *)0xaaaaaaaaaaaaaaaa;
    std::array<std::optional<QByteArrayView>,_4UL>::operator[]
              ((array<std::optional<QByteArrayView>,_4UL> *)in_stack_fffffffffffffde0,
               (size_type)in_stack_fffffffffffffdd8);
    pQVar5 = std::optional<QByteArrayView>::value
                       ((optional<QByteArrayView> *)in_stack_fffffffffffffdd0);
    local_e0 = pQVar5->m_size;
    local_d8 = pQVar5->m_data;
    QByteArrayView::QByteArrayView<4ul>
              (in_stack_fffffffffffffde0,(char (*) [4])in_stack_fffffffffffffdd8);
    a.m_data = (storage_type *)in_stack_fffffffffffffe28;
    a.m_size = in_stack_fffffffffffffe20;
    iVar2 = QByteArrayView::compare((QByteArrayView *)in_RDI,a,cs);
    if (iVar2 != 0) {
      QByteArrayView::QByteArrayView<5ul>
                (in_stack_fffffffffffffde0,(char (*) [5])in_stack_fffffffffffffdd8);
      a_00.m_data = (storage_type *)in_stack_fffffffffffffe28;
      a_00.m_size = in_stack_fffffffffffffe20;
      iVar2 = QByteArrayView::compare((QByteArrayView *)in_RDI,a_00,cs);
      if (iVar2 != 0) {
        std::optional<QUrl>::optional((optional<QUrl> *)0x292582);
        uVar7 = extraout_RDX_01;
        goto LAB_0029279c;
      }
    }
    local_108[0].d = (QUrlPrivate *)0xaaaaaaaaaaaaaaaa;
    QUrl::QUrl(local_108);
    std::array<std::optional<QByteArrayView>,_4UL>::operator[]
              ((array<std::optional<QByteArrayView>,_4UL> *)in_stack_fffffffffffffde0,
               (size_type)in_stack_fffffffffffffdd8);
    pQVar5 = std::optional<QByteArrayView>::value
                       ((optional<QByteArrayView> *)in_stack_fffffffffffffdd0);
    local_140 = pQVar5->m_size;
    local_138 = pQVar5->m_data;
    s.m_data = (storage_type *)in_stack_fffffffffffffde8;
    s.m_size = (qsizetype)in_stack_fffffffffffffde0;
    QLatin1String::QLatin1String((QLatin1String *)in_stack_fffffffffffffdd8,s);
    latin1.m_data = (char *)pQVar10;
    latin1.m_size = (qsizetype)_Var9;
    QString::QString((QString *)in_stack_fffffffffffffde0,latin1);
    QUrl::setScheme((QString *)local_108);
    QString::~QString((QString *)0x292630);
    std::array<std::optional<QByteArrayView>,_4UL>::operator[]
              ((array<std::optional<QByteArrayView>,_4UL> *)in_stack_fffffffffffffde0,
               (size_type)in_stack_fffffffffffffdd8);
    pQVar5 = std::optional<QByteArrayView>::value
                       ((optional<QByteArrayView> *)in_stack_fffffffffffffdd0);
    local_178 = pQVar5->m_size;
    local_170 = pQVar5->m_data;
    s_00.m_data = (storage_type *)in_stack_fffffffffffffde8;
    s_00.m_size = (qsizetype)in_stack_fffffffffffffde0;
    QLatin1String::QLatin1String((QLatin1String *)in_stack_fffffffffffffdd8,s_00);
    latin1_00.m_data = (char *)pQVar10;
    latin1_00.m_size = (qsizetype)_Var9;
    QString::QString((QString *)in_stack_fffffffffffffde0,latin1_00);
    QUrl::setAuthority((QString *)local_108,(ParsingMode)local_158);
    QString::~QString((QString *)0x2926be);
    std::array<std::optional<QByteArrayView>,_4UL>::operator[]
              ((array<std::optional<QByteArrayView>,_4UL> *)in_stack_fffffffffffffde0,
               (size_type)in_stack_fffffffffffffdd8);
    std::optional<QByteArrayView>::value((optional<QByteArrayView> *)in_stack_fffffffffffffdd0);
    s_01.m_data = (storage_type *)in_stack_fffffffffffffde8;
    s_01.m_size = (qsizetype)in_stack_fffffffffffffde0;
    QLatin1String::QLatin1String((QLatin1String *)in_stack_fffffffffffffdd8,s_01);
    latin1_01.m_data = (char *)pQVar10;
    latin1_01.m_size = (qsizetype)_Var9;
    QString::QString((QString *)in_stack_fffffffffffffde0,latin1_01);
    QUrl::setPath((QString *)local_108,(ParsingMode)local_190);
    QString::~QString((QString *)0x292750);
    uVar6 = QUrl::isValid();
    if ((uVar6 & 1) == 0) {
      std::optional<QUrl>::optional((optional<QUrl> *)0x29276b);
    }
    else {
      std::optional<QUrl>::optional<QUrl,_true>
                ((optional<QUrl> *)in_stack_fffffffffffffdd0,(QUrl *)__t);
    }
    QUrl::~QUrl(local_108);
    uVar7 = extraout_RDX_02;
  }
  else {
    std::optional<QUrl>::optional((optional<QUrl> *)0x2924b4);
    uVar7 = extraout_RDX_00;
  }
LAB_0029279c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    oVar8.super__Optional_base<QUrl,_false,_false>._M_payload.
    super__Optional_payload<QUrl,_true,_false,_false>.super__Optional_payload_base<QUrl>._8_8_ =
         uVar7;
    oVar8.super__Optional_base<QUrl,_false,_false>._M_payload.
    super__Optional_payload<QUrl,_true,_false,_false>.super__Optional_payload_base<QUrl>._M_payload
         = _Var9;
    return (optional<QUrl>)
           oVar8.super__Optional_base<QUrl,_false,_false>._M_payload.
           super__Optional_payload<QUrl,_true,_false,_false>.super__Optional_payload_base<QUrl>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<QUrl> makePromiseKeyUrl(const HttpHeader &requestHeader)
{
    constexpr QByteArrayView names[] = { ":authority", ":method", ":path", ":scheme" };
    enum PseudoHeaderEnum
    {
        Authority,
        Method,
        Path,
        Scheme
    };
    std::array<std::optional<QByteArrayView>, std::size(names)> pseudoHeaders{};
    for (const auto &field : requestHeader) {
        const auto *it = std::find(std::begin(names), std::end(names), QByteArrayView(field.name));
        if (it != std::end(names)) {
            const auto index = std::distance(std::begin(names), it);
            if (field.value.isEmpty() || pseudoHeaders.at(index).has_value())
                return {};
            pseudoHeaders[index] = field.value;
        }
    }

    auto optionalIsSet = [](const auto &x) { return x.has_value(); };
    if (!std::all_of(pseudoHeaders.begin(), pseudoHeaders.end(), optionalIsSet)) {
        // All four required, HTTP/2 8.1.2.3.
        return {};
    }

    const QByteArrayView method = pseudoHeaders[Method].value();
    if (method.compare("get", Qt::CaseInsensitive) != 0 &&
        method.compare("head", Qt::CaseInsensitive) != 0) {
        return {};
    }

    QUrl url;
    url.setScheme(QLatin1StringView(pseudoHeaders[Scheme].value()));
    url.setAuthority(QLatin1StringView(pseudoHeaders[Authority].value()));
    url.setPath(QLatin1StringView(pseudoHeaders[Path].value()));

    if (!url.isValid())
        return {};
    return url;
}